

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall ACSStringPool::LockString(ACSStringPool *this,int strnum)

{
  uint uVar1;
  PoolEntry *pPVar2;
  int strnum_local;
  ACSStringPool *this_local;
  
  if ((strnum & 0xfff00000U) != 0x7ff00000) {
    __assert_fail("(strnum & LIBRARYID_MASK) == STRPOOL_LIBRARYID_OR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_acs.cpp"
                  ,0x1ae,"void ACSStringPool::LockString(int)");
  }
  uVar1 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Size(&this->Pool);
  if ((strnum & 0xfffffU) < uVar1) {
    pPVar2 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                       (&this->Pool,(long)(int)(strnum & 0xfffffU));
    pPVar2->LockCount = pPVar2->LockCount + 1;
    return;
  }
  __assert_fail("(unsigned)strnum < Pool.Size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_acs.cpp"
                ,0x1b0,"void ACSStringPool::LockString(int)");
}

Assistant:

void ACSStringPool::LockString(int strnum)
{
	assert((strnum & LIBRARYID_MASK) == STRPOOL_LIBRARYID_OR);
	strnum &= ~LIBRARYID_MASK;
	assert((unsigned)strnum < Pool.Size());
	Pool[strnum].LockCount++;
}